

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

void Abc_NtkBddImplicationTest(void)

{
  DdNode **ppDVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  DdManager *unique;
  DdNode *pDVar5;
  DdNode *n;
  abctime aVar6;
  abctime clk;
  int i;
  int nImps;
  int nVars;
  DdNode *bTemp;
  DdNode *bSum;
  DdNode *bImp;
  DdManager *dd;
  
  aVar4 = Abc_Clock();
  unique = Cudd_Init(200,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SIFT);
  bTemp = (DdNode *)((ulong)unique->one ^ 1);
  Cudd_Ref(bTemp);
  for (clk._4_4_ = 0; clk._4_4_ < 200; clk._4_4_ = clk._4_4_ + 1) {
    printf(".");
    ppDVar1 = unique->vars;
    iVar2 = rand();
    pDVar5 = ppDVar1[iVar2 % 200];
    ppDVar1 = unique->vars;
    iVar2 = rand();
    pDVar5 = Cudd_bddAnd(unique,pDVar5,ppDVar1[iVar2 % 200]);
    Cudd_Ref(pDVar5);
    n = Cudd_bddOr(unique,bTemp,pDVar5);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(unique,bTemp);
    Cudd_RecursiveDeref(unique,pDVar5);
    bTemp = n;
  }
  uVar3 = Cudd_DagSize(bTemp);
  printf("The BDD before = %d.\n",(ulong)uVar3);
  Cudd_ReduceHeap(unique,CUDD_REORDER_SIFT,1);
  uVar3 = Cudd_DagSize(bTemp);
  printf("The BDD after  = %d.\n",(ulong)uVar3);
  Abc_Print(1,"%s =","Time");
  aVar6 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
  Cudd_RecursiveDeref(unique,bTemp);
  Cudd_Quit(unique);
  return;
}

Assistant:

void Abc_NtkBddImplicationTest()
{
    DdManager * dd;
    DdNode * bImp, * bSum, * bTemp;
    int nVars = 200;
    int nImps = 200;
    int i;
    abctime clk;
clk = Abc_Clock();
    dd = Cudd_Init( nVars, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd, CUDD_REORDER_SIFT );
    bSum = b0;   Cudd_Ref( bSum );
    for ( i = 0; i < nImps; i++ )
    {
        printf( "." );
        bImp = Cudd_bddAnd( dd, dd->vars[rand()%nVars], dd->vars[rand()%nVars] );  Cudd_Ref( bImp );
        bSum = Cudd_bddOr( dd, bTemp = bSum, bImp );     Cudd_Ref( bSum );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bImp );
    }
    printf( "The BDD before = %d.\n", Cudd_DagSize(bSum) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SIFT, 1 );
    printf( "The BDD after  = %d.\n", Cudd_DagSize(bSum) );
ABC_PRT( "Time", Abc_Clock() - clk );
    Cudd_RecursiveDeref( dd, bSum );
    Cudd_Quit( dd );
}